

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void bifisc(bifcxdef *ctx,int argc)

{
  runsdef **pprVar1;
  uchar uVar2;
  ushort uVar3;
  runcxdef *prVar4;
  voccxdef *voc;
  runsdef *prVar5;
  int iVar6;
  errcxdef *peVar7;
  runsdef val;
  runsdef rStack_18;
  
  prVar4 = ctx->bifcxrun;
  voc = prVar4->runcxvoc;
  prVar5 = prVar4->runcxsp + -1;
  uVar2 = prVar4->runcxsp[-1].runstyp;
  prVar4->runcxsp = prVar5;
  if (uVar2 == '\x05') {
    pprVar1 = &ctx->bifcxrun->runcxsp;
    *pprVar1 = *pprVar1 + -1;
    runpnil(ctx->bifcxrun);
    return;
  }
  prVar4 = ctx->bifcxrun;
  if (prVar5->runstyp == '\x02') {
    prVar5 = prVar4->runcxsp;
    uVar3 = (prVar5->runsv).runsvobj;
    prVar4->runcxsp = prVar5 + -1;
    if (prVar5[-1].runstyp == '\x02') {
      prVar4 = ctx->bifcxrun;
      iVar6 = bifinh(voc,voc->voccxinh[uVar3 >> 8][(byte)uVar3],(prVar4->runcxsp->runsv).runsvobj);
      runpush(prVar4,(uint)(iVar6 != 0) * 3 + 5,&rStack_18);
      return;
    }
    peVar7 = ctx->bifcxrun->runcxerr;
  }
  else {
    peVar7 = prVar4->runcxerr;
  }
  peVar7->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3f2);
}

Assistant:

void bifisc(bifcxdef *ctx, int argc)
{
    objnum    obj;
    objnum    cls;
    runsdef   val;
    voccxdef *voc = ctx->bifcxrun->runcxvoc;
    
    bifcntargs(ctx, 2, argc);

    /* if checking for nil, return nil */
    if (runtostyp(ctx->bifcxrun) == DAT_NIL)
    {
        rundisc(ctx->bifcxrun);
        rundisc(ctx->bifcxrun);
        runpnil(ctx->bifcxrun);
        return;
    }

    /* get the arguments:  object, class */
    obj = runpopobj(ctx->bifcxrun);
    cls = runpopobj(ctx->bifcxrun);

    /* return the result from bifinh() */
    runpush(ctx->bifcxrun, runclog(bifinh(voc, vocinh(voc, obj), cls)), &val);
}